

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_CallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
          *playout,RecyclableObject *function,uint flags,AuxArray<unsigned_int> *spreadIndices)

{
  ushort uVar1;
  ThreadContext *pTVar2;
  long lVar3;
  InterpreterStackFrame *pIVar4;
  code *pcVar5;
  bool bVar6;
  ArgSlot AVar7;
  RegSlot RVar8;
  RegSlot RVar9;
  undefined4 *puVar10;
  Var value;
  JavascriptMethod p_Var11;
  undefined8 *puVar12;
  uint uVar13;
  Type TVar14;
  Type TVar15;
  Arguments local_98;
  Arguments local_88;
  Arguments local_78;
  Arguments local_68;
  ThreadContext *local_58;
  AuxArray<unsigned_int> *local_50;
  Type local_48;
  RecyclableObject *local_40;
  ImplicitCallFlags local_32;
  bool local_31;
  
  pTVar2 = (*(ScriptContext **)(this + 0x78))->threadContext;
  local_32 = pTVar2->implicitCallFlags;
  lVar3 = *(long *)(*(long *)(this + 0x88) + 0x20);
  local_50 = spreadIndices;
  if (((*(long *)(lVar3 + 0x80) != 0) || ((*(byte *)(lVar3 + 0xa8) & 0x20) != 0)) &&
     ((*(byte *)(lVar3 + 0xa8) & 0x40) != 0)) {
    JavascriptFunction::CheckValidDebugThunk(*(ScriptContext **)(this + 0x78),function);
  }
  uVar1 = (playout->
          super_OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
          super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
          super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
          super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.ArgCount;
  uVar13 = (uint)uVar1;
  local_31 = pTVar2->isInReentrancySafeRegion;
  pTVar2->isInReentrancySafeRegion = true;
  local_48 = *(Type *)(this + 0x28);
  local_58 = pTVar2;
  local_40 = function;
  if ((playout->
      super_OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
      super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
      super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return == 0xffffffff) {
    if (0xff < flags) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf7d,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar6) goto LAB_00a88e9f;
      *puVar10 = 0;
    }
    AVar7 = CallInfo::GetArgCountWithExtraArgs
                      (flags & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                               CallFlags_New) | CallFlags_NotUsed,uVar13);
    TVar15._0_4_ = (flags | 0x10) << 0x18 | uVar13;
    TVar15._4_4_ = 0;
    if (local_50 == (AuxArray<unsigned_int> *)0x0) {
      p_Var11 = RecyclableObject::GetEntryPoint(local_40);
      local_88.Values = local_48;
      local_88.Info = TVar15;
      JavascriptFunction::CallFunction<true>(local_40,p_Var11,&local_88,false);
    }
    else {
      local_98.Values = local_48;
      local_98.Info = TVar15;
      JavascriptFunction::CallSpreadFunction(local_40,&local_98,local_50);
    }
  }
  else {
    if (0xff < flags) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf8c,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar6) goto LAB_00a88e9f;
      *puVar10 = 0;
    }
    AVar7 = CallInfo::GetArgCountWithExtraArgs
                      (flags & (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                                CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                               CallFlags_New) | CallFlags_Value,uVar13);
    TVar14._0_4_ = (flags | 2) << 0x18 | (uint)uVar1;
    TVar14._4_4_ = 0;
    uVar13 = (playout->
             super_OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
             ).super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
             super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
             super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return;
    if (local_50 == (AuxArray<unsigned_int> *)0x0) {
      p_Var11 = RecyclableObject::GetEntryPoint(local_40);
      local_68.Values = local_48;
      local_68.Info = TVar14;
      value = JavascriptFunction::CallFunction<true>(local_40,p_Var11,&local_68,false);
    }
    else {
      local_78.Values = local_48;
      local_78.Info = TVar14;
      value = JavascriptFunction::CallSpreadFunction(local_40,&local_78,local_50);
    }
    SetReg<unsigned_int>(this,uVar13,value);
  }
  local_58->isInReentrancySafeRegion = local_31;
  local_58->implicitCallFlags = local_32;
  if ((ArgSlot)(AVar7 + 1) == 0) {
    ::Math::DefaultOverflowPolicy();
  }
  puVar12 = (undefined8 *)(*(long *)(this + 0x30) + (ulong)(ushort)(AVar7 + 1) * -8);
  *(undefined8 **)(this + 0x30) = puVar12;
  *(undefined8 *)(this + 0x28) = *puVar12;
  RVar8 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
  pIVar4 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar8 * 8 + 0x160 <= pIVar4) {
    RVar8 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    RVar9 = FunctionBody::GetOutParamMaxDepth(*(FunctionBody **)(this + 0x88));
    if (pIVar4 < this + (ulong)RVar9 * 8 + (ulong)RVar8 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar10 = 1;
  bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar6) {
    *puVar10 = 0;
    return;
  }
LAB_00a88e9f:
  pcVar5 = (code *)invalidInstructionException();
  (*pcVar5)();
}

Assistant:

void InterpreterStackFrame::OP_CallCommon(const unaligned T * playout, RecyclableObject * function, unsigned flags, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always save and restore implicit call flags when calling out
        // REVIEW: Can we avoid it if we don't collect dynamic profile info?
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        Js::ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif
#endif
        ArgSlot argCount = playout->ArgCount;
        BEGIN_SAFE_REENTRANT_REGION(threadContext)
        {
            if (playout->Return == Js::Constants::NoRegister)
            {
                flags |= CallFlags_NotUsed;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    JavascriptFunction::CallSpreadFunction(function, args, spreadIndices);
                }
                else
                {
                    JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                }
            }
            else
            {
                flags |= CallFlags_Value;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallSpreadFunction(function, args, spreadIndices));
                }
                else
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args));
                }
            }
        }
        END_SAFE_REENTRANT_REGION

            threadContext->SetImplicitCallFlags(savedImplicitCallFlags);
        PopOut(argCount);
    }